

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vendor.cpp
# Opt level: O0

bool __thiscall SimpleVendor::ProcessUserInput(SimpleVendor *this)

{
  int iVar1;
  SimpleVendor *this_local;
  
  iVar1 = (*this->vio->_vptr_VendorIo[8])();
  switch((char)iVar1) {
  case 'D':
  case 'd':
    iVar1 = Vendor::GetBalance(&this->super_Vendor);
    Vendor::SetBalance(&this->super_Vendor,iVar1 + 10);
    break;
  case 'E':
  case 'e':
    DispenseChange(this);
    (*this->vio->_vptr_VendorIo[7])();
    return false;
  default:
    (**this->vio->_vptr_VendorIo)(this->vio,"Unknown coin - rejected");
    break;
  case 'N':
  case 'n':
    iVar1 = Vendor::GetBalance(&this->super_Vendor);
    Vendor::SetBalance(&this->super_Vendor,iVar1 + 5);
    break;
  case 'Q':
  case 'q':
    iVar1 = Vendor::GetBalance(&this->super_Vendor);
    Vendor::SetBalance(&this->super_Vendor,iVar1 + 0x19);
    break;
  case 'R':
  case 'r':
    DispenseChange(this);
  }
  return true;
}

Assistant:

bool SimpleVendor::ProcessUserInput() {
    switch (vio->GetUserInput()) {
        case 'n':
        case 'N':
            SetBalance(GetBalance() + VALUE_NICKLE);
            break;
        case 'd':
        case 'D':
            SetBalance(GetBalance() + VALUE_DIME);
            break;
        case 'q':
        case 'Q':
            SetBalance(GetBalance() + VALUE_QUARTER);
            break;
        case 'e':
        case 'E':
            DispenseChange();
            vio->PrintExitMessage();
            return false;
        case 'r':
        case 'R':
            DispenseChange();
            break;
        default:
            vio->PrintErrorMessage("Unknown coin - rejected");
    }
    return true;
}